

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O2

void __thiscall QAccessibleTable::QAccessibleTable(QAccessibleTable *this,QWidget *w)

{
  QObject *pQVar1;
  QTableView *pQVar2;
  QTreeView *pQVar3;
  QListView *pQVar4;
  
  *(code **)this = QPainter::drawPath;
  *(code **)&this->super_QAccessibleSelectionInterface = QTextCursor::hasComplexSelection;
  QAccessibleObject::QAccessibleObject(&this->super_QAccessibleObject,&w->super_QObject);
  *(undefined ***)this = &PTR__QAccessibleTable_007e4278;
  *(undefined ***)&this->super_QAccessibleSelectionInterface = &PTR__QAccessibleTable_007e43d0;
  *(undefined ***)&this->super_QAccessibleObject = &PTR__QAccessibleTable_007e4430;
  (this->childToId).d = (Data *)0x0;
  pQVar1 = (QObject *)view(this);
  pQVar2 = QtPrivate::qobject_cast_helper<QTableView_const*,QObject>(pQVar1);
  if (pQVar2 == (QTableView *)0x0) {
    pQVar1 = (QObject *)view(this);
    pQVar3 = QtPrivate::qobject_cast_helper<QTreeView_const*,QObject>(pQVar1);
    if (pQVar3 != (QTreeView *)0x0) {
      this->m_role = Tree;
      return;
    }
    pQVar1 = (QObject *)view(this);
    pQVar4 = QtPrivate::qobject_cast_helper<QListView_const*,QObject>(pQVar1);
    if (pQVar4 != (QListView *)0x0) {
      this->m_role = List;
      return;
    }
  }
  this->m_role = Table;
  return;
}

Assistant:

QAccessibleTable::QAccessibleTable(QWidget *w)
    : QAccessibleObject(w)
{
    Q_ASSERT(view());

#if QT_CONFIG(tableview)
    if (qobject_cast<const QTableView*>(view())) {
        m_role = QAccessible::Table;
    } else
#endif
#if QT_CONFIG(treeview)
    if (qobject_cast<const QTreeView*>(view())) {
        m_role = QAccessible::Tree;
    } else
#endif
#if QT_CONFIG(listview)
    if (qobject_cast<const QListView*>(view())) {
        m_role = QAccessible::List;
    } else
#endif
    {
        // is this our best guess?
        m_role = QAccessible::Table;
    }
}